

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void read_config_file(string *config_path)

{
  xml_node<char> *pxVar1;
  long *plVar2;
  xml_node<char> *node;
  long *plVar3;
  size_type *psVar4;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  vector<char,_std::allocator<char>_> buffer;
  string dir_path;
  ifstream config_file;
  xml_document<char> document;
  vector<char,_std::allocator<char>_> vStack_10378;
  string sStack_10360;
  long *plStack_10340;
  long lStack_10338;
  long lStack_10330;
  long lStack_10328;
  string sStack_10320;
  long alStack_10300 [29];
  undefined8 auStack_10218 [36];
  xml_document<char> xStack_100f8;
  
  std::ifstream::ifstream(alStack_10300,(string *)config_path,_S_in);
  __first._8_8_ = 0xffffffff;
  __first._M_sbuf = *(streambuf_type **)((long)auStack_10218 + *(long *)(alStack_10300[0] + -0x18));
  std::vector<char,std::allocator<char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<char,std::allocator<char>> *)&vStack_10378,__first,
             (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
             (allocator_type *)&xStack_100f8);
  xStack_100f8.super_xml_node<char>.super_xml_base<char>.m_name =
       (char *)((ulong)xStack_100f8.super_xml_node<char>.super_xml_base<char>.m_name &
               0xffffffffffffff00);
  if (vStack_10378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      vStack_10378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
              (&vStack_10378,
               (iterator)
               vStack_10378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,(char *)&xStack_100f8);
  }
  else {
    *vStack_10378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
     _M_finish = '\0';
    vStack_10378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = vStack_10378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  xStack_100f8.super_memory_pool<char>.m_end =
       (char *)&xStack_100f8.super_memory_pool<char>.m_alloc_func;
  xStack_100f8.super_xml_node<char>.m_contents = (char *)0x0;
  xStack_100f8.super_xml_node<char>.m_contents_size = 0;
  xStack_100f8.super_xml_node<char>.m_prev_sibling = (xml_node<char> *)0x0;
  xStack_100f8.super_xml_node<char>.m_next_sibling = (xml_node<char> *)0x0;
  xStack_100f8.super_xml_node<char>.m_first_attribute = (xml_attribute<char> *)0x0;
  xStack_100f8.super_xml_node<char>.m_last_attribute = (xml_attribute<char> *)0x0;
  xStack_100f8.super_xml_node<char>.m_first_node = (xml_node<char> *)0x0;
  xStack_100f8.super_xml_node<char>.m_last_node = (xml_node<char> *)0x0;
  xStack_100f8.super_memory_pool<char>.m_begin =
       xStack_100f8.super_memory_pool<char>.m_static_memory;
  xStack_100f8.super_memory_pool<char>.m_alloc_func = (alloc_func *)0x0;
  xStack_100f8.super_memory_pool<char>.m_free_func = (free_func *)0x0;
  xStack_100f8.super_xml_node<char>.super_xml_base<char>.m_name = (char *)0x0;
  xStack_100f8.super_xml_node<char>.super_xml_base<char>.m_value = (char *)0x0;
  xStack_100f8.super_xml_node<char>.super_xml_base<char>.m_name_size = 0;
  xStack_100f8.super_xml_node<char>.super_xml_base<char>.m_value_size = 0;
  xStack_100f8.super_xml_node<char>.super_xml_base<char>.m_parent = (xml_node<char> *)0x0;
  xStack_100f8.super_xml_node<char>.m_prefix = (char *)0x0;
  xStack_100f8.super_xml_node<char>.m_xmlns = (char *)0x0;
  xStack_100f8.super_xml_node<char>.m_prefix_size._0_4_ = 0;
  xStack_100f8.super_xml_node<char>.m_prefix_size._4_4_ = 0;
  xStack_100f8.super_xml_node<char>.m_xmlns_size._0_4_ = 0;
  xStack_100f8.super_xml_node<char>._68_8_ = 0;
  xStack_100f8.super_memory_pool<char>.m_nullstr = (char *)0x0;
  xStack_100f8.super_memory_pool<char>.m_xmlns_xml = (char *)0x0;
  xStack_100f8.super_memory_pool<char>.m_xmlns_xmlns = (char *)0x0;
  xStack_100f8.super_memory_pool<char>.m_ptr = xStack_100f8.super_memory_pool<char>.m_begin;
  rapidxml::xml_document<char>::parse<0>
            (&xStack_100f8,
             vStack_10378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,(xml_document<char> *)0x0);
  pxVar1 = rapidxml::xml_node<char>::first_node
                     (&xStack_100f8.super_xml_node<char>,"samples",(char *)0x0,0,0,true);
  get_dir(&sStack_10320,config_path);
  plVar2 = (long *)std::__cxx11::string::append((char *)&sStack_10320);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    lStack_10330 = *plVar3;
    lStack_10328 = plVar2[3];
    plStack_10340 = &lStack_10330;
  }
  else {
    lStack_10330 = *plVar3;
    plStack_10340 = (long *)*plVar2;
  }
  lStack_10338 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&plStack_10340);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    sStack_10360.field_2._M_allocated_capacity = *psVar4;
    sStack_10360.field_2._8_8_ = plVar2[3];
    sStack_10360._M_dataplus._M_p = (pointer)&sStack_10360.field_2;
  }
  else {
    sStack_10360.field_2._M_allocated_capacity = *psVar4;
    sStack_10360._M_dataplus._M_p = (pointer)*plVar2;
  }
  sStack_10360._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (plStack_10340 != &lStack_10330) {
    operator_delete(plStack_10340);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_10320._M_dataplus._M_p != &sStack_10320.field_2) {
    operator_delete(sStack_10320._M_dataplus._M_p);
  }
  node = rapidxml::xml_node<char>::first_node(pxVar1,"overlapping",(char *)0x0,0,0,true);
  for (; node != (xml_node<char> *)0x0;
      node = rapidxml::xml_node<char>::next_sibling(node,"overlapping",(char *)0x0,0,0,true)) {
    read_overlapping_instance(node);
  }
  pxVar1 = rapidxml::xml_node<char>::first_node(pxVar1,"simpletiled",(char *)0x0,0,0,true);
  for (; pxVar1 != (xml_node<char> *)0x0;
      pxVar1 = rapidxml::xml_node<char>::next_sibling(pxVar1,"simpletiled",(char *)0x0,0,0,true)) {
    read_simpletiled_instance(pxVar1,&sStack_10360);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_10360._M_dataplus._M_p != &sStack_10360.field_2) {
    operator_delete(sStack_10360._M_dataplus._M_p);
  }
  rapidxml::memory_pool<char>::clear(&xStack_100f8.super_memory_pool<char>);
  if (vStack_10378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(vStack_10378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::ifstream::~ifstream(alStack_10300);
  return;
}

Assistant:

void read_config_file(const string &config_path) noexcept {
  ifstream config_file(config_path);
  vector<char> buffer((istreambuf_iterator<char>(config_file)),
                      istreambuf_iterator<char>());
  buffer.push_back('\0');
  xml_document<> document;
  document.parse<0>(&buffer[0]);

  xml_node<> *root_node = document.first_node("samples");
  string dir_path = get_dir(config_path) + "/" + "samples";
  for (xml_node<> *node = root_node->first_node("overlapping"); node;
       node = node->next_sibling("overlapping")) {
    read_overlapping_instance(node);
  }
  for (xml_node<> *node = root_node->first_node("simpletiled"); node;
       node = node->next_sibling("simpletiled")) {
    read_simpletiled_instance(node, dir_path);
  }
}